

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_ordinaryFunction_apply
          (sysbvm_context_t *context,sysbvm_tuple_t function,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t right;
  undefined1 local_90 [8];
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_3a3b9956 gcFrame;
  sysbvm_tuple_t errorTuple;
  sysbvm_function_t *functionObject;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  argumentCount_local = function;
  if (*(long *)(function + 0x40) != 0) {
    if (*(long *)(function + 0x40) == 0x5f) {
      sVar2 = sysbvm_string_createWithCString
                        (context,"Applying function with cyclic pending lazy analysis process ");
      right = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(function + 0x10));
      sVar2 = sysbvm_string_concat(context,sVar2,right);
      sysbvm_errorWithMessageTuple(sVar2);
    }
    gcFrameRecord.roots = (sysbvm_tuple_t *)function;
    memset(&argumentsRecord.roots,0,0x20);
    gcFrameRecord.previous._0_4_ = 0;
    gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
    gcFrameRecord._12_4_ = 0;
    gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord.roots);
    local_90 = (undefined1  [8])0x0;
    argumentsRecord.previous._0_4_ = 0;
    argumentsRecord._8_8_ = argumentCount;
    argumentsRecord.rootCount = (size_t)arguments;
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_90);
    sysbvm_function_ensureAnalysis(context,(sysbvm_function_t **)&gcFrameRecord.roots);
    argumentCount_local = (size_t)gcFrameRecord.roots;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_90);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord.roots);
  }
  _Var1 = sysbvm_function_isMemoized(context,argumentCount_local);
  if (_Var1) {
    context_local =
         (sysbvm_context_t *)
         sysbvm_ordinaryFunction_memoizedApply
                   (context,argumentCount_local,argumentCount,arguments,applicationFlags);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_ordinaryFunction_directApply
                   (context,argumentCount_local,argumentCount,arguments,applicationFlags);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_apply(sysbvm_context_t *context, sysbvm_tuple_t function, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    // Make sure the closure with lazy analysis is done and reified.
    sysbvm_function_t* functionObject = (sysbvm_function_t*)function;
    if(functionObject->captureEnvironment)
    {
        if(functionObject->captureEnvironment == SYSBVM_PENDING_MEMOIZATION_VALUE)
        {
            sysbvm_tuple_t errorTuple = sysbvm_string_concat(context,
                sysbvm_string_createWithCString(context, "Applying function with cyclic pending lazy analysis process "),
                sysbvm_tuple_printString(context, functionObject->super.name)
            );
            sysbvm_errorWithMessageTuple(errorTuple);
        }

        struct {
            sysbvm_tuple_t function;
        } gcFrame = {
            .function = function
        };
        SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

        sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
            .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
            .rootCount = argumentCount,
            .roots = arguments
        };
        sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

        sysbvm_function_ensureAnalysis(context, (sysbvm_function_t**)&gcFrame.function);

        function = gcFrame.function;
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    }

    if(sysbvm_function_isMemoized(context, function))
        return sysbvm_ordinaryFunction_memoizedApply(context, function, argumentCount, arguments, applicationFlags);
    return sysbvm_ordinaryFunction_directApply(context, function, argumentCount, arguments, applicationFlags);
}